

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppjit.hpp
# Opt level: O2

void __thiscall
cppjit::kernel<bool,_cppjit::detail::pack<int,_double>_>::kernel
          (kernel<bool,_cppjit::detail::pack<int,_double>_> *this,string *kernel_name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Alloc_hider local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  std::__cxx11::string::string((string *)this,(string *)kernel_name);
  std::make_shared<cppjit::builder::gcc,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28);
  _Var1._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->builder).super___shared_ptr<cppjit::builder::builder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_28._M_p;
  (this->builder).super___shared_ptr<cppjit::builder::builder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  local_28._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_20);
  *(undefined8 *)&(this->kernel_implementation).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->kernel_implementation).super__Function_base._M_functor + 8) = 0;
  (this->kernel_implementation).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->kernel_implementation)._M_invoker = (_Invoker_type)0x0;
  this->verbose = false;
  return;
}

Assistant:

kernel(const std::string &kernel_name)
      : kernel_name(kernel_name),
        builder(std::make_shared<cppjit::builder::gcc>(kernel_name)),
        verbose(false) {}